

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_TAGGED_POLICY_Unmarshal(TPMS_TAGGED_POLICY *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  if (iVar1 < 4) {
    return 0x9a;
  }
  UVar2 = ByteArrayToUint32(*buffer);
  target->handle = UVar2;
  *buffer = *buffer + 4;
  TVar3 = TPMT_HA_Unmarshal(&target->policyHash,buffer,size,0);
  return TVar3;
}

Assistant:

TPM_RC
TPMS_TAGGED_POLICY_Unmarshal(TPMS_TAGGED_POLICY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)&(target->handle), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_HA_Unmarshal((TPMT_HA *)&(target->policyHash), buffer, size, 0);
    return result;
}